

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O0

btScalar __thiscall
btMLCPSolver::solveGroupCacheFriendlyIterations
          (btMLCPSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  btSolverConstraint *pbVar1;
  byte bVar2;
  int iVar3;
  btSolverConstraint **ppbVar4;
  btSolverBody *this_00;
  btSolverBody *this_01;
  float *pfVar5;
  long *in_RDI;
  undefined4 uVar6;
  undefined4 uVar7;
  btVector3 bVar8;
  long in_stack_00000010;
  btScalar deltaImpulse_1;
  btScalar deltaImpulse;
  btSolverBody *solverBodyB;
  btSolverBody *solverBodyA;
  int sbB;
  int sbA;
  btSolverConstraint *c;
  int i;
  CProfileSample __profile_1;
  CProfileSample __profile;
  bool result;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  CProfileSample *in_stack_fffffffffffffdf0;
  btVector3 *in_stack_fffffffffffffdf8;
  btVector3 *in_stack_fffffffffffffe00;
  btTypedConstraint **in_stack_fffffffffffffe30;
  btVector3 *in_stack_fffffffffffffe38;
  btScalar impulseMagnitude;
  btVector3 *in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48 [16];
  btSequentialImpulseConstraintSolver *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88 [16];
  int local_4c;
  
  CProfileSample::CProfileSample
            (in_stack_fffffffffffffdf0,
             (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  bVar2 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_stack_00000010);
  CProfileSample::~CProfileSample((CProfileSample *)0x262e18);
  if ((bVar2 & 1) == 0) {
    *(int *)(in_RDI + 0x5d) = (int)in_RDI[0x5d] + 1;
    btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe48._8_8_,
               in_stack_fffffffffffffe48._4_4_,(btPersistentManifold **)in_stack_fffffffffffffe40,
               (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe88._0_8_,
               in_stack_fffffffffffffe88._8_8_);
  }
  else {
    CProfileSample::CProfileSample
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_4c = 0;
    while( true ) {
      iVar3 = btAlignedObjectArray<btSolverConstraint_*>::size
                        ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x58));
      if (iVar3 <= local_4c) break;
      ppbVar4 = btAlignedObjectArray<btSolverConstraint_*>::operator[]
                          ((btAlignedObjectArray<btSolverConstraint_*> *)(in_RDI + 0x58),local_4c);
      pbVar1 = *ppbVar4;
      iVar3 = pbVar1->m_solverBodyIdB;
      this_00 = btAlignedObjectArray<btSolverBody>::operator[]
                          ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 1),
                           pbVar1->m_solverBodyIdA);
      this_01 = btAlignedObjectArray<btSolverBody>::operator[]
                          ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 1),iVar3);
      btVectorX<float>::operator[]
                ((btVectorX<float> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
      pfVar5 = btVectorX<float>::operator[]
                         ((btVectorX<float> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
      pbVar1->m_appliedImpulse = *pfVar5;
      btSolverBody::internalGetInvMass(this_00);
      ::operator*(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      btSolverBody::internalApplyImpulse
                (in_stack_fffffffffffffe48._8_8_,in_stack_fffffffffffffe48._0_8_,
                 in_stack_fffffffffffffe40,(btScalar)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      btSolverBody::internalGetInvMass(this_01);
      ::operator*(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      btSolverBody::internalApplyImpulse
                (in_stack_fffffffffffffe48._8_8_,in_stack_fffffffffffffe48._0_8_,
                 in_stack_fffffffffffffe40,(btScalar)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      impulseMagnitude = (btScalar)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      if (*(int *)(in_stack_00000010 + 0x2c) != 0) {
        btVectorX<float>::operator[]
                  ((btVectorX<float> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
        uVar6 = 0;
        uVar7 = 0;
        btSolverBody::internalGetInvMass(this_00);
        bVar8 = ::operator*(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        in_stack_fffffffffffffe48._8_4_ = uVar6;
        in_stack_fffffffffffffe48._0_8_ = bVar8.m_floats._8_8_;
        in_stack_fffffffffffffe48._12_4_ = uVar7;
        btSolverBody::internalApplyPushImpulse
                  (in_stack_fffffffffffffe48._8_8_,bVar8.m_floats._8_8_,in_stack_fffffffffffffe40,
                   impulseMagnitude);
        in_stack_fffffffffffffe38 = &pbVar1->m_contactNormal2;
        in_stack_fffffffffffffe40 = btSolverBody::internalGetInvMass(this_01);
        ::operator*(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        btSolverBody::internalApplyPushImpulse
                  (in_stack_fffffffffffffe48._8_8_,in_stack_fffffffffffffe48._0_8_,
                   in_stack_fffffffffffffe40,(btScalar)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        in_stack_fffffffffffffe00 =
             (btVector3 *)
             btVectorX<float>::operator[]
                       ((btVectorX<float> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
        pbVar1->m_appliedPushImpulse = in_stack_fffffffffffffe00->m_floats[0];
      }
      local_4c = local_4c + 1;
    }
    CProfileSample::~CProfileSample((CProfileSample *)0x263353);
  }
  return 0.0;
}

Assistant:

btScalar btMLCPSolver::solveGroupCacheFriendlyIterations(btCollisionObject** bodies ,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	bool result = true;
	{
		BT_PROFILE("solveMLCP");
//		printf("m_A(%d,%d)\n", m_A.rows(),m_A.cols());
		result = solveMLCP(infoGlobal);
	}

	//check if solution is valid, and otherwise fallback to btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
	if (result)
	{
		BT_PROFILE("process MLCP results");
		for (int i=0;i<m_allConstraintPtrArray.size();i++)
		{
			{
				btSolverConstraint& c = *m_allConstraintPtrArray[i];
				int sbA = c.m_solverBodyIdA;
				int sbB = c.m_solverBodyIdB;
				//btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

				btSolverBody& solverBodyA = m_tmpSolverBodyPool[sbA];
				btSolverBody& solverBodyB = m_tmpSolverBodyPool[sbB];
 
				{
					btScalar deltaImpulse = m_x[i]-c.m_appliedImpulse;
					c.m_appliedImpulse = m_x[i];
					solverBodyA.internalApplyImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
				}

				if (infoGlobal.m_splitImpulse)
				{
					btScalar deltaImpulse = m_xSplit[i] - c.m_appliedPushImpulse;
					solverBodyA.internalApplyPushImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyPushImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
					c.m_appliedPushImpulse = m_xSplit[i];
				}
				
			}
		}
	}
	else
	{
	//	printf("m_fallback = %d\n",m_fallback);
		m_fallback++;
		btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations(bodies ,numBodies,manifoldPtr, numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
	}

	return 0.f;
}